

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 sqlite3GetVarint(uchar *p,u64 *v)

{
  byte bVar1;
  byte bVar2;
  u8 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  bVar1 = *p;
  uVar6 = (ulong)(char)bVar1;
  if ((long)uVar6 < 0) {
    bVar2 = p[1];
    if ((long)(char)bVar2 < 0) {
      uVar5 = ((uint)bVar1 << 0xe | (uint)p[2]) & 0x1fc07f;
      if ((char)p[2] < '\0') {
        uVar7 = ((uint)bVar2 << 0xe | (uint)p[3]) & 0x1fc07f;
        if ((char)p[3] < '\0') {
          bVar1 = p[4];
          uVar4 = uVar5 << 0xe | (uint)bVar1;
          if ((char)bVar1 < '\0') {
            uVar5 = uVar5 << 7 | uVar7;
            uVar7 = uVar7 << 0xe | (uint)p[5];
            if ((char)p[5] < '\0') {
              uVar4 = uVar4 << 0xe | (uint)p[6];
              if ((char)p[6] < '\0') {
                uVar4 = uVar4 & 0x1fc07f;
                uVar7 = uVar7 << 0xe | (uint)p[7];
                if ((char)p[7] < '\0') {
                  uVar6 = CONCAT44(bVar1 >> 3 & 0xf | uVar5 << 4,
                                   (uVar7 & 0x1fc07f) << 8 | (uint)p[8] | uVar4 << 0xf);
                  uVar3 = '\t';
                }
                else {
                  uVar6 = CONCAT44(uVar5 >> 4,uVar4 << 7 | uVar7 & 0xf01fc07f);
                  uVar3 = '\b';
                }
              }
              else {
                uVar6 = CONCAT44(uVar5 >> 0xb,(uVar7 & 0x1fc07f) << 7 | uVar4 & 0xf01fc07f);
                uVar3 = '\a';
              }
            }
            else {
              uVar6 = CONCAT44(uVar5 >> 0x12,uVar7 | (uVar4 & 0x1fc07f) << 7);
              uVar3 = '\x06';
            }
          }
          else {
            uVar6 = CONCAT44(uVar5 >> 0x12,uVar4 | uVar7 << 7);
            uVar3 = '\x05';
          }
        }
        else {
          uVar6 = (ulong)(uVar5 << 7 | uVar7);
          uVar3 = '\x04';
        }
      }
      else {
        uVar6 = (ulong)(uVar5 | (bVar2 & 0x7f) << 7);
        uVar3 = '\x03';
      }
    }
    else {
      uVar6 = (ulong)(((int)(char)bVar1 & 0x7fU) << 7) | (long)(char)bVar2;
      uVar3 = '\x02';
    }
  }
  else {
    uVar3 = '\x01';
  }
  *v = uVar6;
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u8 sqlite3GetVarint(const unsigned char *p, u64 *v){
  u32 a,b,s;

  if( ((signed char*)p)[0]>=0 ){
    *v = *p;
    return 1;
  }
  if( ((signed char*)p)[1]>=0 ){
    *v = ((u32)(p[0]&0x7f)<<7) | p[1];
    return 2;
  }

  /* Verify that constants are precomputed correctly */
  assert( SLOT_2_0 == ((0x7f<<14) | (0x7f)) );
  assert( SLOT_4_2_0 == ((0xfU<<28) | (0x7f<<14) | (0x7f)) );

  a = ((u32)p[0])<<14;
  b = p[1];
  p += 2;
  a |= *p;
  /* a: p0<<14 | p2 (unmasked) */
  if (!(a&0x80))
  {
    a &= SLOT_2_0;
    b &= 0x7f;
    b = b<<7;
    a |= b;
    *v = a;
    return 3;
  }

  /* CSE1 from below */
  a &= SLOT_2_0;
  p++;
  b = b<<14;
  b |= *p;
  /* b: p1<<14 | p3 (unmasked) */
  if (!(b&0x80))
  {
    b &= SLOT_2_0;
    /* moved CSE1 up */
    /* a &= (0x7f<<14)|(0x7f); */
    a = a<<7;
    a |= b;
    *v = a;
    return 4;
  }

  /* a: p0<<14 | p2 (masked) */
  /* b: p1<<14 | p3 (unmasked) */
  /* 1:save off p0<<21 | p1<<14 | p2<<7 | p3 (masked) */
  /* moved CSE1 up */
  /* a &= (0x7f<<14)|(0x7f); */
  b &= SLOT_2_0;
  s = a;
  /* s: p0<<14 | p2 (masked) */

  p++;
  a = a<<14;
  a |= *p;
  /* a: p0<<28 | p2<<14 | p4 (unmasked) */
  if (!(a&0x80))
  {
    /* we can skip these cause they were (effectively) done above
    ** while calculating s */
    /* a &= (0x7f<<28)|(0x7f<<14)|(0x7f); */
    /* b &= (0x7f<<14)|(0x7f); */
    b = b<<7;
    a |= b;
    s = s>>18;
    *v = ((u64)s)<<32 | a;
    return 5;
  }

  /* 2:save off p0<<21 | p1<<14 | p2<<7 | p3 (masked) */
  s = s<<7;
  s |= b;
  /* s: p0<<21 | p1<<14 | p2<<7 | p3 (masked) */

  p++;
  b = b<<14;
  b |= *p;
  /* b: p1<<28 | p3<<14 | p5 (unmasked) */
  if (!(b&0x80))
  {
    /* we can skip this cause it was (effectively) done above in calc'ing s */
    /* b &= (0x7f<<28)|(0x7f<<14)|(0x7f); */
    a &= SLOT_2_0;
    a = a<<7;
    a |= b;
    s = s>>18;
    *v = ((u64)s)<<32 | a;
    return 6;
  }

  p++;
  a = a<<14;
  a |= *p;
  /* a: p2<<28 | p4<<14 | p6 (unmasked) */
  if (!(a&0x80))
  {
    a &= SLOT_4_2_0;
    b &= SLOT_2_0;
    b = b<<7;
    a |= b;
    s = s>>11;
    *v = ((u64)s)<<32 | a;
    return 7;
  }

  /* CSE2 from below */
  a &= SLOT_2_0;
  p++;
  b = b<<14;
  b |= *p;
  /* b: p3<<28 | p5<<14 | p7 (unmasked) */
  if (!(b&0x80))
  {
    b &= SLOT_4_2_0;
    /* moved CSE2 up */
    /* a &= (0x7f<<14)|(0x7f); */
    a = a<<7;
    a |= b;
    s = s>>4;
    *v = ((u64)s)<<32 | a;
    return 8;
  }

  p++;
  a = a<<15;
  a |= *p;
  /* a: p4<<29 | p6<<15 | p8 (unmasked) */

  /* moved CSE2 up */
  /* a &= (0x7f<<29)|(0x7f<<15)|(0xff); */
  b &= SLOT_2_0;
  b = b<<8;
  a |= b;

  s = s<<4;
  b = p[-4];
  b &= 0x7f;
  b = b>>3;
  s |= b;

  *v = ((u64)s)<<32 | a;

  return 9;
}